

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O1

void __thiscall QGraphicsAnchorPrivate::unsetSpacing(QGraphicsAnchorPrivate *this)

{
  if (this->data != (AnchorData *)0x0) {
    this->field_0x98 = this->field_0x98 & 0xfe;
    (*((this->layoutPrivate->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr)->
      _vptr_QGraphicsLayoutItem[7])();
    return;
  }
  unsetSpacing();
  return;
}

Assistant:

void QGraphicsAnchorPrivate::unsetSpacing()
{
    if (!data) {
        qWarning("QGraphicsAnchor::setSpacing: The anchor does not exist.");
        return;
    }

    // Return to standard direction
    hasSize = false;

    layoutPrivate->q_func()->invalidate();
}